

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

void __thiscall
cfd::core::JsonClassBase<cfd::api::json::DecodeUnlockingScript>::Deserialize
          (JsonClassBase<cfd::api::json::DecodeUnlockingScript> *this,string *value)

{
  size_t in_RCX;
  UniValue object;
  UniValue local_60;
  
  local_60.val._M_dataplus._M_p = (pointer)&local_60.val.field_2;
  local_60.val._M_string_length = 0;
  local_60.val.field_2._M_local_buf[0] = '\0';
  local_60.typ = VNULL;
  local_60.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniValue::read(&local_60,(int)(value->_M_dataplus)._M_p,(void *)value->_M_string_length,in_RCX);
  (*this->_vptr_JsonClassBase[8])(this,&local_60);
  UniValue::~UniValue(&local_60);
  return;
}

Assistant:

virtual void Deserialize(const std::string& value) {
    UniValue object;
    object.read(value);
    DeserializeUniValue(object);
  }